

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_cast.cpp
# Opt level: O3

unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true> __thiscall
duckdb::ExpressionExecutor::InitializeState
          (ExpressionExecutor *this,BoundCastExpression *expr,ExpressionExecutorState *root)

{
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> _Var1;
  optional_ptr<duckdb::ClientContext,_true> oVar2;
  bool bVar3;
  ExecuteFunctionState *this_00;
  pointer pEVar4;
  type child_expr;
  CastLocalStateParameters parameters;
  CastLocalStateParameters local_40;
  ClientContext *local_30;
  BoundCastData *local_28;
  
  this_00 = (ExecuteFunctionState *)operator_new(0xb8);
  ExecuteFunctionState::ExecuteFunctionState(this_00,&expr->super_Expression,root);
  local_40.cast_data.ptr = (BoundCastData *)this_00;
  pEVar4 = unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
           ::operator->((unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
                         *)&local_40.cast_data);
  child_expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&expr->child);
  ExpressionState::AddChild(&pEVar4->super_ExpressionState,child_expr);
  pEVar4 = unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
           ::operator->((unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
                         *)&local_40.cast_data);
  ExpressionState::Finalize(&pEVar4->super_ExpressionState);
  if ((expr->bound_cast).init_local_state != (init_cast_local_state_t)0x0) {
    bVar3 = HasContext(root->executor);
    if (bVar3) {
      local_30 = GetContext(root->executor);
    }
    else {
      local_30 = (ClientContext *)0x0;
    }
    local_28 = (expr->bound_cast).cast_data.
               super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
               .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
    (*(expr->bound_cast).init_local_state)(&local_40);
    pEVar4 = unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
             ::operator->((unique_ptr<duckdb::ExecuteFunctionState,_std::default_delete<duckdb::ExecuteFunctionState>,_true>
                           *)&local_40.cast_data);
    oVar2.ptr = local_40.context.ptr;
    local_40.context.ptr = (ClientContext *)0x0;
    _Var1._M_head_impl =
         (pEVar4->local_state).
         super_unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
         .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl;
    (pEVar4->local_state).
    super_unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
    .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl =
         (FunctionLocalState *)oVar2.ptr;
    if (_Var1._M_head_impl != (FunctionLocalState *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_FunctionLocalState[1])();
      if (local_40.context.ptr != (ClientContext *)0x0) {
        (*(code *)((((local_40.context.ptr)->super_enable_shared_from_this<duckdb::ClientContext>).
                    __weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
    }
  }
  (this->expressions).
  super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_40.cast_data.ptr;
  return (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
         (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)this;
}

Assistant:

unique_ptr<ExpressionState> ExpressionExecutor::InitializeState(const BoundCastExpression &expr,
                                                                ExpressionExecutorState &root) {
	auto result = make_uniq<ExecuteFunctionState>(expr, root);
	result->AddChild(*expr.child);
	result->Finalize();

	if (expr.bound_cast.init_local_state) {
		auto context_ptr = root.executor->HasContext() ? &root.executor->GetContext() : nullptr;
		CastLocalStateParameters parameters(context_ptr, expr.bound_cast.cast_data);
		result->local_state = expr.bound_cast.init_local_state(parameters);
	}
	return std::move(result);
}